

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCallArgument.cpp
# Opt level: O2

string * __thiscall
ninx::parser::element::FunctionCallArgument::dump_abi_cxx11_
          (string *__return_storage_ptr__,FunctionCallArgument *this,int level)

{
  Expression *pEVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string _name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string((string *)&_name,"<implicit>",(allocator *)&local_b8);
  if ((this->name)._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::__cxx11::string::_M_assign((string *)&_name);
  }
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_d8,(char)level);
  std::operator+(&local_58,&local_d8,"FunctionCallArgument: ");
  std::operator+(&local_38,&local_58,&_name);
  std::operator+(&local_b8,&local_38," = ");
  pEVar1 = (this->value)._M_t.
           super___uniq_ptr_impl<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
           ._M_t.
           super__Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
           .super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl;
  (**(code **)(*(long *)&(pEVar1->super_Statement).super_ASTElement + 0x18))
            (&local_78,pEVar1,level + 1);
  std::operator+(__return_storage_ptr__,&local_b8,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&_name);
  return __return_storage_ptr__;
}

Assistant:

std::string ninx::parser::element::FunctionCallArgument::dump(int level) const {
    std::string _name {"<implicit>"};
    if (this->name) {
        _name = *(this->name);
    }
    return std::string(level, '\t')+ "FunctionCallArgument: "+_name + " = "+ this->value->dump(level+1);
}